

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void wasm::anon_unknown_18::doCodeInlining
               (Module *module,Function *into,InliningAction *action,PassOptions *options)

{
  Function *this;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Drop *left;
  undefined8 uVar1;
  bool bVar2;
  Index IVar3;
  int iVar4;
  Function *this_00;
  ulong uVar5;
  size_t sVar6;
  Type TVar7;
  mapped_type *pmVar8;
  Block *pBVar9;
  ExpressionList *pEVar10;
  Expression **ppEVar11;
  LocalSet *pLVar12;
  Break *pBVar13;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar14;
  size_type sVar15;
  reference pvVar16;
  Return *pRVar17;
  undefined4 extraout_var;
  Expression *pEVar18;
  string *in_R9;
  Name NVar19;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  Name root;
  Name root_00;
  optional<wasm::Type> type_;
  Name target;
  optional<wasm::Type> type_03;
  optional<wasm::Type> type_04;
  byte local_791;
  byte local_5d9;
  undefined1 local_5c0 [12];
  Drop *local_5b0;
  Expression *old;
  Expression *local_5a0;
  Expression *contents;
  undefined1 local_590 [12];
  uintptr_t local_580;
  key_type local_574;
  uintptr_t local_570;
  Type local_568;
  value_type type;
  Type TStack_558;
  Index i_3;
  key_type local_54c;
  size_t sStack_548;
  Index i_2;
  size_t sStack_540;
  BasicType local_52c;
  undefined1 local_528 [12];
  size_t local_518;
  size_t sStack_510;
  key_type local_4fc;
  Block *pBStack_4f8;
  Index i_1;
  Block *branchBlock;
  size_t local_4e8;
  size_t numParams;
  undefined1 local_4d8;
  undefined3 uStack_4d7;
  BasicType local_4cc;
  undefined1 local_4c8 [12];
  Expression *local_4b8;
  Return *local_4b0;
  initializer_list<wasm::Expression_*> local_4a8;
  size_t local_498;
  char *pcStack_490;
  BasicType local_484;
  undefined1 local_480 [12];
  Return *local_470;
  initializer_list<wasm::Expression_*> local_468;
  size_t local_458;
  char *pcStack_450;
  allocator<char> local_441;
  string local_440 [32];
  anon_class_8_1_42a10368 local_420;
  function<bool_(wasm::Name)> local_418;
  Name local_3f8;
  size_t sStack_3e8;
  Name bodyName;
  NameSet intoNames;
  key_type local_39c;
  Type TStack_398;
  Index i;
  undefined1 local_390 [8];
  Updater updater;
  string local_228 [32];
  anon_class_16_2_91eecf75 local_208;
  function<bool_(wasm::Name)> local_1f8;
  Names *local_1d8;
  size_t sStack_1d0;
  string_view local_1c8;
  undefined1 local_1b8 [8];
  NameSet callNames;
  NameSet fromNames;
  undefined1 local_130 [7];
  bool hoistCall;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Block *block;
  Builder builder;
  Type local_40;
  Type retType;
  Call *call;
  Function *from;
  PassOptions *options_local;
  InliningAction *action_local;
  Function *into_local;
  Module *module_local;
  
  this = action->contents;
  retType.id = (uintptr_t)Expression::cast<wasm::Call>(*action->callSite);
  builder.wasm = (Module *)(((Call *)retType.id)->target).super_IString.str._M_len;
  this_00 = Module::getFunction(module,(Name)(((Call *)retType.id)->target).super_IString.str);
  local_40 = Function::getResults(this_00);
  Builder::Builder((Builder *)&block,module);
  name.field_2._8_8_ = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"__inlined_func$",&local_a9);
  IString::toString_abi_cxx11_(&local_e0,(IString *)this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (action->nameHint != 0) {
    std::__cxx11::to_string(&local_120,action->nameHint);
    std::operator+(&local_100,'$',&local_120);
    std::__cxx11::string::operator+=((string *)local_88,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  wasm::Name::Name((Name *)local_130,(string *)local_88);
  wasm::Name::operator=((Name *)(name.field_2._8_8_ + 0x10),(Name *)local_130);
  local_5d9 = 0;
  if ((*(byte *)(retType.id + 0x40) & 1) != 0) {
    local_5d9 = action->insideATry;
  }
  local_5d9 = local_5d9 & 1;
  NVar19.super_IString.str._M_str = (char *)retType.id;
  NVar19.super_IString.str._M_len = *(size_t *)(name.field_2._8_8_ + 0x18);
  TVar7 = retType;
  bVar2 = BranchUtils::hasBranchTarget
                    ((BranchUtils *)this->body,*(Expression **)(name.field_2._8_8_ + 0x10),NVar19);
  if (!bVar2) {
    if (local_5d9 != 0) goto LAB_01d7eb7e;
    target.super_IString.str._M_str = (char *)TVar7.id;
    target.super_IString.str._M_len = *(size_t *)(name.field_2._8_8_ + 0x18);
    bVar2 = BranchUtils::BranchSeeker::has
                      ((BranchSeeker *)retType.id,*(Expression **)(name.field_2._8_8_ + 0x10),target
                      );
    if (!bVar2) goto LAB_01d7eb7e;
  }
  BranchUtils::getBranchTargets
            ((NameSet *)&callNames._M_t._M_impl.super__Rb_tree_header._M_node_count,this->body);
  if (local_5d9 == 0) {
    BranchUtils::BranchAccumulator::get((NameSet *)local_1b8,(Expression *)retType.id);
  }
  else {
    memset(local_1b8,0,0x30);
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_1b8);
  }
  local_1d8 = *(Names **)(name.field_2._8_8_ + 0x10);
  sStack_1d0 = *(size_t *)(name.field_2._8_8_ + 0x18);
  local_208.fromNames = (NameSet *)&callNames._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_208.callNames = (NameSet *)local_1b8;
  std::function<bool(wasm::Name)>::
  function<wasm::(anonymous_namespace)::doCodeInlining(wasm::Module*,wasm::Function*,wasm::(anonymous_namespace)::InliningAction_const&,wasm::PassOptions&)::__0,void>
            ((function<bool(wasm::Name)> *)&local_1f8,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,"_",
             (allocator<char> *)
             ((long)&updater.returnCallInfos.
                     super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  root.super_IString.str._M_str = (char *)&local_1f8;
  root.super_IString.str._M_len = sStack_1d0;
  local_1c8 = (string_view)
              Names::getValidName(local_1d8,root,(function<bool_(wasm::Name)> *)0x0,(Index)local_228
                                  ,in_R9);
  wasm::Name::operator=((Name *)(name.field_2._8_8_ + 0x10),(Name *)&local_1c8);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&updater.returnCallInfos.
                     super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::function<bool_(wasm::Name)>::~function(&local_1f8);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_1b8);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
             &callNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_01d7eb7e:
  Updater::Updater((Updater *)local_390,options);
  Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  ::setFunction((Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 *)local_390,into);
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth = (size_t)module;
  TStack_398 = Function::getResults(this);
  updater.returnName.super_IString.str._M_str = (char *)TStack_398;
  wasm::Name::operator=
            ((Name *)&updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Name *)(name.field_2._8_8_ + 0x10));
  updater.resultType.id._0_1_ = *(byte *)(retType.id + 0x40) & 1;
  updater._304_8_ = &block;
  local_39c = 0;
  while( true ) {
    uVar5 = (ulong)local_39c;
    sVar6 = Function::getNumLocals(this);
    if (sVar6 <= uVar5) break;
    TVar7 = Function::getLocalType(this,local_39c);
    IVar3 = Builder::addVar(into,TVar7);
    pmVar8 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)&updater.module,&local_39c);
    *pmVar8 = IVar3;
    local_39c = local_39c + 1;
  }
  if (local_5d9 == 0) {
    local_54c = 0;
    while( true ) {
      uVar5 = (ulong)local_54c;
      TStack_558 = Function::getParams(this);
      sVar6 = wasm::Type::size(&stack0xfffffffffffffaa8);
      if (sVar6 <= uVar5) break;
      pAVar14 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                (name.field_2._8_8_ + 0x20);
      pmVar8 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&updater.module,&local_54c);
      IVar3 = *pmVar8;
      ppEVar11 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (retType.id + 0x10),(ulong)local_54c);
      pLVar12 = Builder::makeLocalSet((Builder *)&block,IVar3,*ppEVar11);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (pAVar14,(Expression *)pLVar12);
      local_54c = local_54c + 1;
    }
    type.id._4_4_ = 0;
    while( true ) {
      uVar5 = (ulong)type.id._4_4_;
      sVar15 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(&this->vars);
      if (sVar15 <= uVar5) break;
      pvVar16 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                          (&this->vars,(ulong)type.id._4_4_);
      local_570 = pvVar16->id;
      local_568.id = local_570;
      bVar2 = LiteralUtils::canMakeZero((Type)local_570);
      if (bVar2) {
        pAVar14 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                  (name.field_2._8_8_ + 0x20);
        IVar3 = Function::getVarIndexBase(this);
        local_574 = IVar3 + type.id._4_4_;
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&updater.module,&local_574);
        IVar3 = *pmVar8;
        local_580 = local_568.id;
        pEVar18 = LiteralUtils::makeZero(local_568,module);
        pLVar12 = Builder::makeLocalSet((Builder *)&block,IVar3,pEVar18);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (pAVar14,(Expression *)pLVar12);
      }
      type.id._4_4_ = type.id._4_4_ + 1;
    }
    if ((*(byte *)(retType.id + 0x40) & 1) == 0) {
      *action->callSite = (Expression *)name.field_2._8_8_;
    }
    else {
      if (((action->insideATry ^ 0xffU) & 1) == 0) {
        __assert_fail("!action.insideATry",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                      ,0x23a,
                      "void wasm::(anonymous namespace)::doCodeInlining(Module *, Function *, const InliningAction &, PassOptions &)"
                     );
      }
      bVar2 = wasm::Type::isConcrete(&local_40);
      uVar1 = name.field_2._8_8_;
      if (bVar2) {
        pRVar17 = Builder::makeReturn((Builder *)&block,(Expression *)name.field_2._8_8_);
        *action->callSite = (Expression *)pRVar17;
      }
      else {
        pRVar17 = Builder::makeReturn((Builder *)&block,(Expression *)0x0);
        std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_590);
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_590._0_8_;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_590[8];
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_590._9_3_;
        pBVar9 = Builder::makeSequence
                           ((Builder *)&block,(Expression *)uVar1,(Expression *)pRVar17,type_01);
        *action->callSite = (Expression *)pBVar9;
      }
    }
  }
  else {
    BranchUtils::BranchAccumulator::get((NameSet *)&bodyName.super_IString.str._M_str,into->body);
    wasm::Name::Name(&local_3f8,"__original_body");
    local_420.intoNames = (NameSet *)&bodyName.super_IString.str._M_str;
    std::function<bool(wasm::Name)>::
    function<wasm::(anonymous_namespace)::doCodeInlining(wasm::Module*,wasm::Function*,wasm::(anonymous_namespace)::InliningAction_const&,wasm::PassOptions&)::__1,void>
              ((function<bool(wasm::Name)> *)&local_418,&local_420);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_440,"_",&local_441);
    root_00.super_IString.str._M_str = (char *)&local_418;
    root_00.super_IString.str._M_len = (size_t)local_3f8.super_IString.str._M_str;
    NVar19 = Names::getValidName((Names *)local_3f8.super_IString.str._M_len,root_00,
                                 (function<bool_(wasm::Name)> *)0x0,(Index)local_440,in_R9);
    bodyName.super_IString.str._M_len = NVar19.super_IString.str._M_str;
    sStack_3e8 = NVar19.super_IString.str._M_len;
    std::__cxx11::string::~string(local_440);
    std::allocator<char>::~allocator(&local_441);
    std::function<bool_(wasm::Name)>::~function(&local_418);
    bVar2 = wasm::Type::isConcrete(&local_40);
    if (bVar2) {
      local_458 = sStack_3e8;
      pcStack_450 = (char *)bodyName.super_IString.str._M_len;
      local_470 = Builder::makeReturn((Builder *)&block,into->body);
      local_468._M_array = (iterator)&local_470;
      local_468._M_len = 1;
      local_484 = none;
      std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
                ((optional<wasm::Type> *)local_480,&local_484);
      name_03.super_IString.str._M_str = pcStack_450;
      name_03.super_IString.str._M_len = local_458;
      type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_480._0_8_;
      type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_480[8];
      type_03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_480._9_3_;
      pBVar9 = Builder::makeBlock((Builder *)&block,name_03,&local_468,type_03);
      into->body = (Expression *)pBVar9;
    }
    else {
      local_498 = sStack_3e8;
      pcStack_490 = (char *)bodyName.super_IString.str._M_len;
      local_4b8 = into->body;
      local_4b0 = Builder::makeReturn((Builder *)&block,(Expression *)0x0);
      local_4a8._M_array = &local_4b8;
      local_4a8._M_len = 2;
      local_4cc = none;
      std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
                ((optional<wasm::Type> *)local_4c8,&local_4cc);
      name_02.super_IString.str._M_str = pcStack_490;
      name_02.super_IString.str._M_len = local_498;
      type_04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_4c8._0_8_;
      type_04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_4c8[8];
      type_04.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_4c8._9_3_;
      pBVar9 = Builder::makeBlock((Builder *)&block,name_02,&local_4a8,type_04);
      into->body = (Expression *)pBVar9;
    }
    uVar1 = name.field_2._8_8_;
    pEVar18 = into->body;
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)&numParams,&local_40);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)numParams;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_4d8;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = uStack_4d7;
    pBVar9 = Builder::makeSequence((Builder *)&block,pEVar18,(Expression *)uVar1,type_00);
    into->body = (Expression *)pBVar9;
    branchBlock = (Block *)Function::getParams(this);
    local_4e8 = wasm::Type::size((Type *)&branchBlock);
    if (local_4e8 == 0) {
      sStack_548 = sStack_3e8;
      sStack_540 = bodyName.super_IString.str._M_len;
      name_00.super_IString.str._M_str = (char *)bodyName.super_IString.str._M_len;
      name_00.super_IString.str._M_len = sStack_3e8;
      pBVar13 = Builder::makeBreak((Builder *)&block,name_00,(Expression *)0x0,(Expression *)0x0);
      *action->callSite = (Expression *)pBVar13;
    }
    else {
      pBStack_4f8 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
      for (local_4fc = 0; local_4fc < local_4e8; local_4fc = local_4fc + 1) {
        pEVar10 = &pBStack_4f8->list;
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&updater.module,&local_4fc);
        IVar3 = *pmVar8;
        ppEVar11 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)(retType.id + 0x10),(ulong)local_4fc);
        pLVar12 = Builder::makeLocalSet((Builder *)&block,IVar3,*ppEVar11);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar10->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar12);
      }
      pEVar10 = &pBStack_4f8->list;
      local_518 = sStack_3e8;
      sStack_510 = bodyName.super_IString.str._M_len;
      name_01.super_IString.str._M_str = (char *)bodyName.super_IString.str._M_len;
      name_01.super_IString.str._M_len = sStack_3e8;
      pBVar13 = Builder::makeBreak((Builder *)&block,name_01,(Expression *)0x0,(Expression *)0x0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar10->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar13);
      pBVar9 = pBStack_4f8;
      local_52c = unreachable;
      std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
                ((optional<wasm::Type> *)local_528,&local_52c);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_528._0_8_;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_528[8];
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_528._9_3_;
      Block::finalize(pBVar9,type_,Unknown);
      *action->callSite = (Expression *)pBStack_4f8;
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &bodyName.super_IString.str._M_str);
  }
  iVar4 = ExpressionManipulator::copy((EVP_PKEY_CTX *)this->body,(EVP_PKEY_CTX *)module);
  local_5a0 = (Expression *)CONCAT44(extraout_var,iVar4);
  debuginfo::copyBetweenFunctions(this->body,local_5a0,this,into);
  Updater::walk((Updater *)local_390,&local_5a0);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             (name.field_2._8_8_ + 0x20),local_5a0);
  *(uintptr_t *)(name.field_2._8_8_ + 8) = local_40.id;
  old._4_4_ = 1;
  bVar2 = wasm::Type::operator==((Type *)(retType.id + 8),(BasicType *)((long)&old + 4));
  local_791 = 0;
  if (bVar2) {
    local_791 = *(byte *)(retType.id + 0x40) ^ 0xff;
  }
  if ((local_791 & 1) != 0) {
    local_5b0 = (Drop *)name.field_2._8_8_;
    bVar2 = wasm::Type::isConcrete((Type *)(name.field_2._8_8_ + 8));
    if (bVar2) {
      local_5b0 = Builder::makeDrop((Builder *)&block,(Expression *)local_5b0);
    }
    left = local_5b0;
    pEVar18 = (Expression *)Builder::makeUnreachable((Builder *)&block);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_5c0);
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_5c0._0_8_;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_5c0[8];
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_5c0._9_3_;
    pBVar9 = Builder::makeSequence((Builder *)&block,(Expression *)left,pEVar18,type_02);
    *action->callSite = (Expression *)pBVar9;
  }
  Updater::~Updater((Updater *)local_390);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

static void doCodeInlining(Module* module,
                           Function* into,
                           const InliningAction& action,
                           PassOptions& options) {
  Function* from = action.contents;
  auto* call = (*action.callSite)->cast<Call>();

  // Works for return_call, too
  Type retType = module->getFunction(call->target)->getResults();

  // Build the block that will contain the inlined contents.
  Builder builder(*module);
  auto* block = builder.makeBlock();
  auto name = std::string("__inlined_func$") + from->name.toString();
  if (action.nameHint) {
    name += '$' + std::to_string(action.nameHint);
  }
  block->name = Name(name);

  // In the unlikely event that the function already has a branch target with
  // this name, fix that up, as otherwise we can get unexpected capture of our
  // branches, that is, we could end up with this:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (from's contents
  //      (block $X         ;; a block in from's contents with a colliding name
  //        (br $X          ;; a new br we just added that replaces a return
  //
  // Here the br wants to go to the very outermost block, to represent a
  // return from the inlined function's code, but it ends up captured by an
  // internal block. We also need to be careful of the call's children:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (local.set $param
  //      (call's first parameter
  //        (br $X)         ;; nested br in call's first parameter
  //      )
  //    )
  //
  // (In this case we could use a second block and define the named block $X
  // after the call's parameters, but that adds work for an extremely rare
  // situation.) The latter case does not apply if the call is a
  // return_call inside a try, because in that case the call's
  // children do not appear inside the same block as the inlined body.
  bool hoistCall = call->isReturn && action.insideATry;
  if (BranchUtils::hasBranchTarget(from->body, block->name) ||
      (!hoistCall && BranchUtils::BranchSeeker::has(call, block->name))) {
    auto fromNames = BranchUtils::getBranchTargets(from->body);
    auto callNames = hoistCall ? BranchUtils::NameSet{}
                               : BranchUtils::BranchAccumulator::get(call);
    block->name = Names::getValidName(block->name, [&](Name test) {
      return !fromNames.count(test) && !callNames.count(test);
    });
  }

  // Prepare to update the inlined code's locals and other things.
  Updater updater(options);
  updater.setFunction(into);
  updater.module = module;
  updater.resultType = from->getResults();
  updater.returnName = block->name;
  updater.isReturn = call->isReturn;
  updater.builder = &builder;
  // Set up a locals mapping
  for (Index i = 0; i < from->getNumLocals(); i++) {
    updater.localMapping[i] = builder.addVar(into, from->getLocalType(i));
  }

  if (hoistCall) {
    // Wrap the existing function body in a block we can branch out of before
    // entering the inlined function body. This block must have a name that is
    // different from any other block name above the branch.
    auto intoNames = BranchUtils::BranchAccumulator::get(into->body);
    auto bodyName =
      Names::getValidName(Name("__original_body"),
                          [&](Name test) { return !intoNames.count(test); });
    if (retType.isConcrete()) {
      into->body = builder.makeBlock(
        bodyName, {builder.makeReturn(into->body)}, Type::none);
    } else {
      into->body = builder.makeBlock(
        bodyName, {into->body, builder.makeReturn()}, Type::none);
    }

    // Sequence the inlined function body after the original caller body.
    into->body = builder.makeSequence(into->body, block, retType);

    // Replace the original callsite with an expression that assigns the
    // operands into the params and branches out of the original body.
    auto numParams = from->getParams().size();
    if (numParams) {
      auto* branchBlock = builder.makeBlock();
      for (Index i = 0; i < numParams; i++) {
        branchBlock->list.push_back(
          builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
      }
      branchBlock->list.push_back(builder.makeBreak(bodyName));
      branchBlock->finalize(Type::unreachable);
      *action.callSite = branchBlock;
    } else {
      *action.callSite = builder.makeBreak(bodyName);
    }
  } else {
    // Assign the operands into the params
    for (Index i = 0; i < from->getParams().size(); i++) {
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
    }
    // Zero out the vars (as we may be in a loop, and may depend on their
    // zero-init value
    for (Index i = 0; i < from->vars.size(); i++) {
      auto type = from->vars[i];
      if (!LiteralUtils::canMakeZero(type)) {
        // Non-zeroable locals do not need to be zeroed out. As they have no
        // zero value they by definition should not be used before being written
        // to, so any value we set here would not be observed anyhow.
        continue;
      }
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[from->getVarIndexBase() + i],
                             LiteralUtils::makeZero(type, *module)));
    }
    if (call->isReturn) {
      assert(!action.insideATry);
      if (retType.isConcrete()) {
        *action.callSite = builder.makeReturn(block);
      } else {
        *action.callSite = builder.makeSequence(block, builder.makeReturn());
      }
    } else {
      *action.callSite = block;
    }
  }

  // Generate and update the inlined contents
  auto* contents = ExpressionManipulator::copy(from->body, *module);
  debuginfo::copyBetweenFunctions(from->body, contents, from, into);
  updater.walk(contents);
  block->list.push_back(contents);
  block->type = retType;

  // The ReFinalize below will handle propagating unreachability if we need to
  // do so, that is, if the call was reachable but now the inlined content we
  // replaced it with was unreachable. The opposite case requires special
  // handling: ReFinalize works under the assumption that code can become
  // unreachable, but it does not go back from that state. But inlining can
  // cause that:
  //
  //  (call $A                               ;; an unreachable call
  //    (unreachable)
  //  )
  // =>
  //  (block $__inlined_A_body (result i32)  ;; reachable code after inlining
  //    (unreachable)
  //  )
  //
  // That is, if the called function wraps the input parameter in a block with a
  // declared type, then the block is not unreachable. And then we might error
  // if the outside expects the code to be unreachable - perhaps it only
  // validates that way. To fix this, if the call was unreachable then we make
  // the inlined code unreachable as well. That also maximizes DCE
  // opportunities by propagating unreachability as much as possible.
  //
  // (Note that we don't need to do this for a return_call, which is always
  // unreachable anyhow.)
  if (call->type == Type::unreachable && !call->isReturn) {
    // Make the replacement code unreachable. Note that we can't just add an
    // unreachable at the end, as the block might have breaks to it (returns are
    // transformed into those).
    Expression* old = block;
    if (old->type.isConcrete()) {
      old = builder.makeDrop(old);
    }
    *action.callSite = builder.makeSequence(old, builder.makeUnreachable());
  }
}